

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool expr_fold_arith(Tk binop,Node *left,Node right)

{
  anon_union_8_6_f630ca3c_for_Node_1 aVar1;
  Node *left_local;
  Tk binop_local;
  Node right_local;
  
  aVar1 = right.field_1;
  if ((left->type == NODE_NUM) && (right.type == NODE_NUM)) {
    switch(binop) {
    case 0x2a:
      (left->field_1).num = aVar1.num * (left->field_1).num;
      break;
    case 0x2b:
      (left->field_1).num = aVar1.num + (left->field_1).num;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x2f0,"_Bool expr_fold_arith(Tk, Node *, Node)");
    case 0x2d:
      (left->field_1).num = (left->field_1).num - aVar1.num;
      break;
    case 0x2f:
      (left->field_1).num = (left->field_1).num / aVar1.num;
    }
    right_local.field_1.jmp.false_list._3_1_ = 1;
  }
  else {
    right_local.field_1.jmp.false_list._3_1_ = 0;
  }
  return (_Bool)right_local.field_1.jmp.false_list._3_1_;
}

Assistant:

static bool expr_fold_arith(Tk binop, Node *left, Node right) {
	// Only fold if both operands are numbers
	if (left->type != NODE_NUM || right.type != NODE_NUM) {
		return false;
	}

	// Compute the result of the fold
	switch (binop) {
		case '+': left->num += right.num; break;
		case '-': left->num -= right.num; break;
		case '*': left->num *= right.num; break;
		case '/': left->num /= right.num; break;
		default: UNREACHABLE();
	}
	return true;
}